

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::iterate
          (TransformFeedbackCase *this)

{
  size_type *psVar1;
  TestLog *pTVar2;
  DrawCall DVar3;
  ostringstream *this_00;
  int iVar4;
  DrawCall *first;
  long lVar5;
  bool bVar6;
  deUint32 dVar7;
  undefined8 *puVar8;
  long *plVar9;
  DrawCall *pDVar10;
  undefined8 uVar11;
  DrawCall DVar12;
  ulong uVar13;
  DrawCall DVar14;
  DrawCall DVar15;
  uint uVar16;
  int iVar17;
  string sectionDesc;
  ScopedLogSection section;
  string sectionName;
  string local_2a0;
  Array<const_deqp::gles3::Functional::TransformFeedback::DrawCall_*> local_280;
  DrawCall local_270;
  long lStack_268;
  TestLog *local_260;
  ScopedLogSection local_258;
  long local_250;
  TestLog local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  string local_218;
  DrawCall *local_1f8;
  long local_1f0;
  DrawCall local_1e8 [2];
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  long local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if (iterate()::s_elemCount1 == '\0') {
    iterate();
  }
  if (iterate()::s_elemCount2 == '\0') {
    iterate();
  }
  if (iterate()::s_elemCount3 == '\0') {
    iterate();
  }
  if (iterate()::s_elemCount4 == '\0') {
    iterate();
  }
  if (iterate()::s_elemCount123 == '\0') {
    iterate();
  }
  if (iterate()::s_basicPause1 == '\0') {
    iterate();
  }
  if (iterate()::s_basicPause2 == '\0') {
    iterate();
  }
  if (iterate()::s_startPaused == '\0') {
    iterate();
  }
  if (iterate()::s_random1 == '\0') {
    iterate();
  }
  if (iterate()::s_random2 == '\0') {
    iterate();
  }
  local_260 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar16 = this->m_iterNdx;
  first = iterate::s_iterations[(int)uVar16].calls;
  iVar17 = iterate::s_iterations[(int)uVar16].numCalls;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Iteration","");
  iVar4 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar4 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  DVar3 = (DrawCall)((long)&(local_280.end)->numElements + local_2a0._M_string_length);
  uVar11._0_4_ = 0xf;
  uVar11._4_1_ = false;
  uVar11._5_3_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    uVar11 = local_2a0.field_2._M_allocated_capacity;
  }
  local_1b8 = (long)iVar17;
  if ((ulong)uVar11 < (ulong)DVar3) {
    DVar12.numElements = 0xf;
    DVar12.transformFeedbackEnabled = false;
    DVar12._5_3_ = 0;
    if (local_280.begin != &local_270) {
      DVar12 = local_270;
    }
    if ((ulong)DVar12 < (ulong)DVar3) goto LAB_0055d505;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_280,0,(char *)0x0,(ulong)local_2a0._M_dataplus._M_p);
  }
  else {
LAB_0055d505:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_280.begin);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_218.field_2._M_allocated_capacity = *psVar1;
    local_218.field_2._8_8_ = puVar8[3];
  }
  else {
    local_218.field_2._M_allocated_capacity = *psVar1;
    local_218._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_218._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_280.begin != &local_270) {
    operator_delete(local_280.begin,(long)local_270 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Iteration ","");
  iVar17 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar17 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  uVar13 = 0xf;
  if (local_238 != local_228) {
    uVar13 = local_228[0];
  }
  if (uVar13 < (ulong)(local_1d0 + local_230)) {
    uVar13 = 0xf;
    if (local_1d8 != local_1c8) {
      uVar13 = local_1c8[0];
    }
    if (uVar13 < (ulong)(local_1d0 + local_230)) goto LAB_0055d684;
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_238)
    ;
  }
  else {
LAB_0055d684:
    plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1d8);
  }
  local_258.m_log = &local_248;
  pTVar2 = (TestLog *)(plVar9 + 2);
  if ((TestLog *)*plVar9 == pTVar2) {
    local_248.m_log = pTVar2->m_log;
    lStack_240 = plVar9[3];
  }
  else {
    local_248.m_log = pTVar2->m_log;
    local_258.m_log = (TestLog *)*plVar9;
  }
  local_250 = plVar9[1];
  *plVar9 = (long)pTVar2;
  plVar9[1] = 0;
  *(undefined1 *)&pTVar2->m_log = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_258);
  pDVar10 = (DrawCall *)(plVar9 + 2);
  if ((DrawCall *)*plVar9 == pDVar10) {
    local_270 = *pDVar10;
    lStack_268 = plVar9[3];
    local_280.begin = &local_270;
  }
  else {
    local_270 = *pDVar10;
    local_280.begin = (DrawCall *)*plVar9;
  }
  local_280.end = (DrawCall *)plVar9[1];
  *plVar9 = (long)pDVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  DVar3 = (DrawCall)((long)&(local_280.end)->numElements + local_1f0);
  DVar14.numElements = 0xf;
  DVar14.transformFeedbackEnabled = false;
  DVar14._5_3_ = 0;
  if (local_280.begin != &local_270) {
    DVar14 = local_270;
  }
  if ((ulong)DVar14 < (ulong)DVar3) {
    DVar15.numElements = 0xf;
    DVar15.transformFeedbackEnabled = false;
    DVar15._5_3_ = 0;
    if (local_1f8 != local_1e8) {
      DVar15 = local_1e8[0];
    }
    if ((ulong)DVar3 <= (ulong)DVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_280.begin)
      ;
      goto LAB_0055d807;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_1f8);
LAB_0055d807:
  pTVar2 = local_260;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2a0.field_2._M_allocated_capacity = *psVar1;
    local_2a0.field_2._8_8_ = puVar8[3];
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *psVar1;
    local_2a0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2a0._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,(long)local_1e8[0] + 1);
  }
  if (local_280.begin != &local_270) {
    operator_delete(local_280.begin,(long)local_270 + 1);
  }
  lVar5 = local_1b8;
  if (local_258.m_log != &local_248) {
    operator_delete(local_258.m_log,(ulong)((long)&(local_248.m_log)->flags + 1));
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar2,&local_218,&local_2a0);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Testing ",8);
  std::ostream::operator<<(this_00,iterate::s_iterations[this->m_iterNdx].numCalls);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," draw calls, (element count, TF state): ",0x28);
  local_280.begin = first;
  local_280.end = first + lVar5;
  tcu::Format::operator<<((ostream *)this_00,&local_280);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  uVar16 = (uVar16 >> 0x10 ^ uVar16 ^ 0x3d) * 9;
  uVar16 = (uVar16 >> 4 ^ uVar16) * 0x27d4eb2d;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  bVar6 = runTest(this,first,first + lVar5,uVar16 >> 0xf ^ dVar7 ^ uVar16);
  if (!bVar6) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Result comparison failed");
  }
  iVar17 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar17;
  tcu::TestLog::endSection(local_258.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return (IterateResult)(bVar6 && iVar17 < 10);
}

Assistant:

TransformFeedbackCase::IterateResult TransformFeedbackCase::iterate (void)
{
	// Test cases.
	static const DrawCall s_elemCount1[]	= { DrawCall(1, true) };
	static const DrawCall s_elemCount2[]	= { DrawCall(2, true) };
	static const DrawCall s_elemCount3[]	= { DrawCall(3, true) };
	static const DrawCall s_elemCount4[]	= { DrawCall(4, true) };
	static const DrawCall s_elemCount123[]	= { DrawCall(123, true) };
	static const DrawCall s_basicPause1[]	= { DrawCall(64, true), DrawCall(64, false), DrawCall(64, true) };
	static const DrawCall s_basicPause2[]	= { DrawCall(13, true), DrawCall(5, true), DrawCall(17, false), DrawCall(3, true), DrawCall(7, false) };
	static const DrawCall s_startPaused[]	= { DrawCall(123, false), DrawCall(123, true) };
	static const DrawCall s_random1[]		= { DrawCall(65, true), DrawCall(135, false), DrawCall(74, true), DrawCall(16, false), DrawCall(226, false), DrawCall(9, true), DrawCall(174, false) };
	static const DrawCall s_random2[]		= { DrawCall(217, true), DrawCall(171, true), DrawCall(147, true), DrawCall(152, false), DrawCall(55, true) };

	static const struct
	{
		const DrawCall*		calls;
		int					numCalls;
	} s_iterations[] =
	{
#define ITER(ARR) { ARR, DE_LENGTH_OF_ARRAY(ARR) }
		ITER(s_elemCount1),
		ITER(s_elemCount2),
		ITER(s_elemCount3),
		ITER(s_elemCount4),
		ITER(s_elemCount123),
		ITER(s_basicPause1),
		ITER(s_basicPause2),
		ITER(s_startPaused),
		ITER(s_random1),
		ITER(s_random2)
#undef ITER
	};

	TestLog&				log				= m_testCtx.getLog();
	bool					isOk			= true;
	deUint32				seed			= deStringHash(getName()) ^ deInt32Hash(m_iterNdx);
	int						numIterations	= DE_LENGTH_OF_ARRAY(s_iterations);
	const DrawCall*			first			= s_iterations[m_iterNdx].calls;
	const DrawCall*			end				= s_iterations[m_iterNdx].calls + s_iterations[m_iterNdx].numCalls;

	std::string				sectionName		= std::string("Iteration") + de::toString(m_iterNdx+1);
	std::string				sectionDesc		= std::string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(numIterations);
	tcu::ScopedLogSection	section			(log, sectionName, sectionDesc);

	log << TestLog::Message << "Testing " << s_iterations[m_iterNdx].numCalls << " draw calls, (element count, TF state): " << tcu::formatArray(first, end) << TestLog::EndMessage;

	isOk = runTest(first, end, seed);

	if (!isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result comparison failed");

	m_iterNdx += 1;
	return (isOk && m_iterNdx < numIterations) ? CONTINUE : STOP;
}